

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O0

int xmrig::CudaLib::init(EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  char *pcVar3;
  undefined7 extraout_var;
  undefined7 uVar4;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  if ((m_initialized & 1) == 0) {
    if (ctx == (EVP_PKEY_CTX *)0x0) {
      ctx = (EVP_PKEY_CTX *)defaultLoader();
    }
    String::operator=((String *)ctx,
                      (char *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
    pcVar3 = String::operator_cast_to_char_((String *)m_loader);
    iVar2 = uv_dlopen(pcVar3,cudaLib);
    uVar4 = 0;
    bVar1 = false;
    if (iVar2 == 0) {
      bVar1 = load();
      uVar4 = extraout_var;
    }
    m_ready = bVar1;
    in_RAX = CONCAT71(uVar4,m_ready);
    m_initialized = 1;
  }
  return (uint)CONCAT71((int7)((ulong)in_RAX >> 8),m_ready) & 0xffffff01;
}

Assistant:

bool xmrig::CudaLib::init(const char *fileName)
{
    if (!m_initialized) {
        m_loader      = fileName == nullptr ? defaultLoader() : fileName;
        m_ready       = uv_dlopen(m_loader, &cudaLib) == 0 && load();
        m_initialized = true;
    }

    return m_ready;
}